

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O1

void __thiscall
ftxui::SliderBase<float>::SliderBase
          (SliderBase<float> *this,ConstStringRef *label,float *value,float min,float max,
          float increment)

{
  pointer pcVar1;
  
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ComponentBase).parent_ = (ComponentBase *)0x0;
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__SliderBase_00175b80;
  (this->label_).owned_._M_dataplus._M_p = (pointer)&(this->label_).owned_.field_2;
  pcVar1 = (label->owned_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->label_,pcVar1,pcVar1 + (label->owned_)._M_string_length);
  (this->label_).address_ = label->address_;
  this->value_ = value;
  this->min_ = min;
  this->max_ = max;
  this->increment_ = increment;
  (this->captured_mouse_)._M_t.
  super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
  .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl =
       (CapturedMouseInterface *)0x0;
  (this->box_).x_min = 0;
  (this->box_).x_max = 0;
  (this->box_).y_min = 0;
  (this->box_).y_max = 0;
  (this->gauge_box_).x_min = 0;
  (this->gauge_box_).x_max = 0;
  (this->gauge_box_).y_min = 0;
  (this->gauge_box_).y_max = 0;
  return;
}

Assistant:

SliderBase(ConstStringRef label, T* value, T min, T max, T increment)
      : label_(label),
        value_(value),
        min_(min),
        max_(max),
        increment_(increment) {}